

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::Indent(ostream *os,int count)

{
  undefined4 local_18;
  int i;
  int count_local;
  ostream *os_local;
  
  for (local_18 = 0; local_18 < count; local_18 = local_18 + 1) {
    std::operator<<(os,INDENT);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Indent(std::ostream& os, int count)
{
  for (int i = 0; i < count; ++i) {
    os << cmGlobalNinjaGenerator::INDENT;
  }
}